

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmatrix.h
# Opt level: O2

DMatrix<double> *
gmath::transpose<double>(DMatrix<double> *__return_storage_ptr__,DMatrix<double> *a)

{
  uint uVar1;
  int iVar2;
  double *pdVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  ulong uVar10;
  
  DMatrix<double>::DMatrix(__return_storage_ptr__,a->ncols,a->nrows);
  uVar1 = __return_storage_ptr__->ncols;
  uVar4 = 0;
  uVar5 = 0;
  if (0 < (int)uVar1) {
    uVar5 = (ulong)uVar1;
  }
  uVar6 = (ulong)(uint)__return_storage_ptr__->nrows;
  if (__return_storage_ptr__->nrows < 1) {
    uVar6 = uVar4;
  }
  lVar7 = 0;
  for (uVar8 = 0; uVar8 != uVar6; uVar8 = uVar8 + 1) {
    iVar2 = a->ncols;
    pdVar3 = __return_storage_ptr__->v;
    puVar9 = (undefined8 *)((long)a->v + uVar4);
    for (uVar10 = 0; uVar5 != uVar10; uVar10 = uVar10 + 1) {
      *(undefined8 *)((long)pdVar3 + uVar10 * 8 + lVar7) = *puVar9;
      puVar9 = puVar9 + iVar2;
    }
    lVar7 = lVar7 + (long)(int)uVar1 * 8;
    uVar4 = uVar4 + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

inline DMatrix<T> transpose(const DMatrix<T> &a)
{
  DMatrix<T> ret(a.cols(), a.rows());

  for (int k=0; k<ret.rows(); k++)
    for (int i=0; i<ret.cols(); i++)
    {
      ret(k, i)=a(i, k);
    }

  return ret;
}